

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void itrans_dct2_h4_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  s16 tmp [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x10));
  auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x10));
  auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar7._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar7._16_16_ = ZEXT116(1) * auVar1;
  auVar8._8_2_ = 0x20;
  auVar8._0_8_ = 0x20002000200020;
  auVar8._10_2_ = 0x20;
  auVar8._12_2_ = 0x20;
  auVar8._14_2_ = 0x20;
  auVar8._16_2_ = 0x20;
  auVar8._18_2_ = 0x20;
  auVar8._20_2_ = 0x20;
  auVar8._22_2_ = 0x20;
  auVar8._24_2_ = 0x20;
  auVar8._26_2_ = 0x20;
  auVar8._28_2_ = 0x20;
  auVar8._30_2_ = 0x20;
  auVar5 = vpmaddwd_avx2(auVar7,_DAT_0017f760);
  auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar6._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar6._16_16_ = ZEXT116(1) * auVar1;
  auVar4 = vpmaddwd_avx2(auVar6,_DAT_0017f720);
  auVar6 = vpmaddwd_avx2(auVar6,_DAT_0017f740);
  auVar9._8_4_ = 0x10;
  auVar9._0_8_ = 0x1000000010;
  auVar9._12_4_ = 0x10;
  auVar9._16_4_ = 0x10;
  auVar9._20_4_ = 0x10;
  auVar9._24_4_ = 0x10;
  auVar9._28_4_ = 0x10;
  auVar7 = vpmaddwd_avx2(auVar7,auVar8);
  auVar8 = vpor_avx2(auVar7,auVar9);
  auVar7 = vpaddd_avx2(auVar8,auVar4);
  auVar9 = vpor_avx2(auVar5,auVar9);
  auVar5 = vpaddd_avx2(auVar9,auVar6);
  auVar6 = vpsubd_avx2(auVar9,auVar6);
  auVar4 = vpsubd_avx2(auVar8,auVar4);
  auVar8 = vpsrad_avx2(auVar7,5);
  auVar9 = vpsrad_avx2(auVar5,5);
  auVar7 = vpsrad_avx2(auVar6,5);
  auVar7 = vpackssdw_avx2(auVar8,auVar7);
  auVar5 = vpsrad_avx2(auVar4,5);
  auVar5 = vpackssdw_avx2(auVar9,auVar5);
  auVar4 = vpunpcklwd_avx2(auVar7,auVar5);
  auVar7 = vpunpckhwd_avx2(auVar7,auVar5);
  auVar5 = vpunpckldq_avx2(auVar4,auVar7);
  auVar7 = vpunpckhdq_avx2(auVar4,auVar7);
  local_80._0_16_ = ZEXT116(0) * auVar7._0_16_ + ZEXT116(1) * auVar5._0_16_;
  local_80._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar7._0_16_;
  local_60 = vperm2i128_avx2(auVar5,auVar7,0x31);
  dct2_butterfly_h8_sse((s16 *)local_80,4,dst,4,0x14 - bit_depth,bit_depth);
  return;
}

Assistant:

void itrans_dct2_h4_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[4 * 8]);
    dct2_butterfly_h4_avx2(src, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_sse(tmp, 4, dst, 4, 20 - bit_depth, bit_depth);
}